

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O3

void __thiscall CLI::App::parse(App *this,string *commandline,bool program_name_included)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  long lVar4;
  long lVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  undefined7 in_register_00000011;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  nstr;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  char *local_170;
  size_type local_168;
  char local_160;
  uint7 uStack_15f;
  undefined8 uStack_158;
  char *local_150;
  size_type local_148;
  char local_140;
  uint7 uStack_13f;
  undefined8 uStack_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  undefined1 local_118 [32];
  _Alloc_hider local_f8;
  char local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  string local_98;
  string local_78;
  undefined1 *local_58 [5];
  
  if ((int)CONCAT71(in_register_00000011,program_name_included) == 0) {
    local_130.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(commandline->_M_dataplus)._M_p;
    local_118._0_8_ =
         (long)&((local_130.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
         commandline->_M_string_length;
    ::std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
              (local_58);
    commandline->_M_string_length = (long)local_58[0] - (long)(commandline->_M_dataplus)._M_p;
    *local_58[0] = 0;
    _Var3 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                      ();
    pcVar2 = (commandline->_M_dataplus)._M_p;
    if (pcVar2 + commandline->_M_string_length == _Var3._M_current) {
      commandline->_M_string_length = 0;
      *pcVar2 = '\0';
    }
    else {
      ::std::__cxx11::string::_M_erase((ulong)commandline,0);
    }
  }
  else {
    pcVar2 = (commandline->_M_dataplus)._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + commandline->_M_string_length);
    detail::split_program_name
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_118,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (((this->name_)._M_string_length == 0) || (this->has_automatic_name_ == true)) {
      this->has_automatic_name_ = true;
      ::std::__cxx11::string::_M_assign((string *)&this->name_);
    }
    ::std::__cxx11::string::operator=((string *)commandline,(string *)&local_f8);
    if (local_f8._M_p != local_e8) {
      operator_delete(local_f8._M_p);
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
  }
  if (commandline->_M_string_length != 0) {
    local_150 = &local_140;
    pcVar2 = (commandline->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar2,pcVar2 + commandline->_M_string_length);
    local_b8[0] = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"=","");
    lVar4 = ::std::__cxx11::string::find((char *)&local_150,(ulong)local_b8[0],0);
    if (lVar4 != -1) {
      do {
        if (((byte)local_150[lVar4 + 1] - 0x22 < 0x3f) &&
           ((0x4000000000000021U >> ((ulong)((byte)local_150[lVar4 + 1] - 0x22) & 0x3f) & 1) != 0))
        {
          lVar5 = ::std::__cxx11::string::find_last_of((char *)&local_150,0x186a1e,lVar4 - 1);
          if ((lVar5 != -1) && ((uint)(local_150[lVar4] != '=') * 2 + 0x2d == (int)local_150[lVar5])
             ) {
            local_150[lVar4] = ' ';
          }
        }
        lVar4 = ::std::__cxx11::string::find((char *)&local_150,(ulong)local_b8[0],lVar4 + 1);
      } while (lVar4 != -1);
    }
    if (local_150 == &local_140) {
      local_118._24_8_ = uStack_138;
      local_118._0_8_ = local_118 + 0x10;
    }
    else {
      local_118._0_8_ = local_150;
    }
    local_118._16_8_ = (ulong)uStack_13f << 8;
    local_118._8_8_ = local_148;
    local_148 = 0;
    local_140 = '\0';
    local_150 = &local_140;
    ::std::__cxx11::string::operator=((string *)commandline,(string *)local_118);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (this->allow_windows_style_options_ == true) {
      local_170 = &local_160;
      pcVar2 = (commandline->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar2,pcVar2 + commandline->_M_string_length);
      local_d8[0] = local_c8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,":","");
      lVar4 = ::std::__cxx11::string::find((char *)&local_170,(ulong)local_d8[0],0);
      if (lVar4 != -1) {
        do {
          if (((byte)local_170[lVar4 + 1] - 0x22 < 0x3f) &&
             ((0x4000000000000021U >> ((ulong)((byte)local_170[lVar4 + 1] - 0x22) & 0x3f) & 1) != 0)
             ) {
            lVar5 = ::std::__cxx11::string::find_last_of((char *)&local_170,0x186a1e,lVar4 - 1);
            if ((lVar5 != -1) &&
               ((uint)(local_170[lVar4] != '=') * 2 + 0x2d == (int)local_170[lVar5])) {
              local_170[lVar4] = ' ';
            }
          }
          lVar4 = ::std::__cxx11::string::find((char *)&local_170,(ulong)local_d8[0],lVar4 + 1);
        } while (lVar4 != -1);
      }
      if (local_170 == &local_160) {
        local_118._24_8_ = uStack_158;
        local_118._0_8_ = local_118 + 0x10;
      }
      else {
        local_118._0_8_ = local_170;
      }
      local_118._16_8_ = (ulong)uStack_15f << 8;
      local_118._8_8_ = local_168;
      local_168 = 0;
      local_160 = '\0';
      local_170 = &local_160;
      ::std::__cxx11::string::operator=((string *)commandline,(string *)local_118);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0]);
      }
      if (local_170 != &local_160) {
        operator_delete(local_170);
      }
    }
  }
  local_98._M_dataplus._M_p = (commandline->_M_dataplus)._M_p;
  paVar1 = &commandline->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar1) {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&commandline->field_2 + 8);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98._M_string_length = commandline->_M_string_length;
  (commandline->_M_dataplus)._M_p = (pointer)paVar1;
  commandline->_M_string_length = 0;
  (commandline->field_2)._M_local_buf[0] = '\0';
  detail::split_up(&local_130,&local_98,'\0');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_118._8_8_ = 0;
  local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
  local_118._0_8_ = local_118 + 0x10;
  __first = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )local_130.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )local_130.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_130,(iterator)__first._M_current,
             (iterator)
             local_130.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_);
  }
  detail::remove_quotes(&local_130);
  pbVar7 = local_130.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  pbVar6 = local_130.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_130.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start < pbVar7 &&
      local_130.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_130.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      ::std::__cxx11::string::swap((string *)pbVar6);
      pbVar6 = pbVar6 + 1;
      pbVar7 = pbVar7 + -1;
    } while (pbVar6 < pbVar7);
  }
  if (this->parsed_ != 0) {
    clear(this);
  }
  this->parsed_ = 1;
  _validate(this);
  _configure(this);
  this->parent_ = (App *)0x0;
  this->parsed_ = 0;
  _parse(this,&local_130);
  run_callback(this,false,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_130);
  return;
}

Assistant:

CLI11_INLINE void App::parse(std::string commandline, bool program_name_included) {

    if(program_name_included) {
        auto nstr = detail::split_program_name(commandline);
        if((name_.empty()) || (has_automatic_name_)) {
            has_automatic_name_ = true;
            name_ = nstr.first;
        }
        commandline = std::move(nstr.second);
    } else {
        detail::trim(commandline);
    }
    // the next section of code is to deal with quoted arguments after an '=' or ':' for windows like operations
    if(!commandline.empty()) {
        commandline = detail::find_and_modify(commandline, "=", detail::escape_detect);
        if(allow_windows_style_options_)
            commandline = detail::find_and_modify(commandline, ":", detail::escape_detect);
    }

    auto args = detail::split_up(std::move(commandline));
    // remove all empty strings
    args.erase(std::remove(args.begin(), args.end(), std::string{}), args.end());
    try {
        detail::remove_quotes(args);
    } catch(const std::invalid_argument &arg) {
        throw CLI::ParseError(arg.what(), CLI::ExitCodes::InvalidError);
    }
    std::reverse(args.begin(), args.end());
    parse(std::move(args));
}